

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void mg_set_websocket_handler
               (mg_context *ctx,char *uri,mg_websocket_connect_handler connect_handler,
               mg_websocket_ready_handler ready_handler,mg_websocket_data_handler data_handler,
               mg_websocket_close_handler close_handler,void *cbdata)

{
  mg_set_handler_type(ctx,&ctx->dd,uri,1,
                      (uint)(((connect_handler == (mg_websocket_connect_handler)0x0 &&
                              ready_handler == (mg_websocket_ready_handler)0x0) &&
                             data_handler == (mg_websocket_data_handler)0x0) &&
                            close_handler == (mg_websocket_close_handler)0x0),
                      (mg_request_handler)0x0,(mg_websocket_subprotocols *)0x0,connect_handler,
                      ready_handler,data_handler,close_handler,(mg_authorization_handler)0x0,cbdata)
  ;
  return;
}

Assistant:

CIVETWEB_API void
mg_set_websocket_handler(struct mg_context *ctx,
                         const char *uri,
                         mg_websocket_connect_handler connect_handler,
                         mg_websocket_ready_handler ready_handler,
                         mg_websocket_data_handler data_handler,
                         mg_websocket_close_handler close_handler,
                         void *cbdata)
{
	mg_set_websocket_handler_with_subprotocols(ctx,
	                                           uri,
	                                           NULL,
	                                           connect_handler,
	                                           ready_handler,
	                                           data_handler,
	                                           close_handler,
	                                           cbdata);
}